

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_amr_transfer.cpp
# Opt level: O0

void Omega_h::amr::transfer_inherit<signed_char>
               (Mesh *old_mesh,Mesh *new_mesh,Few<Omega_h::Read<int>,_4> *prods2new_ents,
               Few<Omega_h::Read<int>,_4> *same_ents2old_ents,
               Few<Omega_h::Read<int>,_4> *same_ents2new_ents,string *name)

{
  uint uVar1;
  void *name_00;
  Int IVar2;
  LO size_in;
  Tag<signed_char> *this;
  Read<int> *pRVar3;
  Write<signed_char> local_2b8;
  Read<signed_char> local_2a8;
  undefined1 local_298 [8];
  type f;
  Parents parents;
  undefined1 local_1c8 [4];
  Int prod_dim_1;
  Read<int> local_1b8;
  Read<signed_char> local_1a8;
  Read<signed_char> local_198;
  Read<int> local_188;
  Write<signed_char> local_178;
  undefined1 local_168 [8];
  Read<signed_char> same_data;
  Read<signed_char> old_data;
  string local_140 [32];
  Write<signed_char> local_120;
  uint local_110;
  Int prod_dim;
  Int local_fc;
  undefined1 local_f8 [4];
  Int ncomps;
  Few<Omega_h::Write<signed_char>,_4> new_data;
  string *name_local;
  Few<Omega_h::Read<int>,_4> *same_ents2new_ents_local;
  Few<Omega_h::Read<int>,_4> *same_ents2old_ents_local;
  Few<Omega_h::Read<int>,_4> *prods2new_ents_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  ulong local_10;
  
  new_data.array_[3].shared_alloc_.direct_ptr = name;
  Few<Omega_h::Write<signed_char>,_4>::Few((Few<Omega_h::Write<signed_char>,_4> *)local_f8);
  this = Omega_h::Mesh::get_tag<signed_char>
                   (old_mesh,0,(string *)new_data.array_[3].shared_alloc_.direct_ptr);
  local_fc = TagBase::ncomps(&this->super_TagBase);
  local_110 = 0;
  while( true ) {
    uVar1 = local_110;
    IVar2 = Omega_h::Mesh::dim(old_mesh);
    if (IVar2 < (int)uVar1) break;
    size_in = Omega_h::Mesh::nents(new_mesh,local_110);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_140,"",(allocator *)((long)&old_data.write_.shared_alloc_.direct_ptr + 7));
    Write<signed_char>::Write(&local_120,size_in,-1,(string *)local_140);
    Write<signed_char>::operator=
              ((Write<signed_char> *)(local_f8 + (long)(int)local_110 * 0x10),&local_120);
    Write<signed_char>::~Write(&local_120);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator
              ((allocator<char> *)((long)&old_data.write_.shared_alloc_.direct_ptr + 7));
    Omega_h::Mesh::get_array<signed_char>
              ((Mesh *)&same_data.write_.shared_alloc_.direct_ptr,(Int)old_mesh,
               (string *)(ulong)local_110);
    Read<int>::Read(&local_188,same_ents2old_ents->array_ + (int)local_110);
    Read<signed_char>::Read
              (&local_198,(Read<signed_char> *)&same_data.write_.shared_alloc_.direct_ptr);
    unmap<signed_char>((Omega_h *)&local_178,&local_188,&local_198,local_fc);
    read<signed_char>((Omega_h *)local_168,&local_178);
    Write<signed_char>::~Write(&local_178);
    Read<signed_char>::~Read(&local_198);
    Read<int>::~Read(&local_188);
    Read<signed_char>::Read(&local_1a8,(Read<signed_char> *)local_168);
    Read<int>::Read(&local_1b8,same_ents2new_ents->array_ + (int)local_110);
    Write<signed_char>::Write
              ((Write<signed_char> *)local_1c8,
               (Write<signed_char> *)(local_f8 + (long)(int)local_110 * 0x10));
    map_into<signed_char>(&local_1a8,&local_1b8,(Write<signed_char> *)local_1c8,local_fc);
    Write<signed_char>::~Write((Write<signed_char> *)local_1c8);
    Read<int>::~Read(&local_1b8);
    Read<signed_char>::~Read(&local_1a8);
    Read<signed_char>::~Read((Read<signed_char> *)local_168);
    Read<signed_char>::~Read((Read<signed_char> *)&same_data.write_.shared_alloc_.direct_ptr);
    local_110 = local_110 + 1;
  }
  parents.codes.write_.shared_alloc_.direct_ptr._4_4_ = 0;
  while( true ) {
    IVar2 = Omega_h::Mesh::dim(old_mesh);
    if (IVar2 < parents.codes.write_.shared_alloc_.direct_ptr._4_4_) break;
    Omega_h::Mesh::ask_parents
              ((Parents *)&f.new_data.array_[3].shared_alloc_.direct_ptr,new_mesh,
               parents.codes.write_.shared_alloc_.direct_ptr._4_4_);
    Few<Omega_h::Read<int>,_4>::Few((Few<Omega_h::Read<int>,_4> *)local_298,prods2new_ents);
    f.prods2new_ents.array_[3].write_.shared_alloc_.direct_ptr._0_4_ =
         parents.codes.write_.shared_alloc_.direct_ptr._4_4_;
    Parents::Parents((Parents *)&f.prod_dim,
                     (Parents *)&f.new_data.array_[3].shared_alloc_.direct_ptr);
    Few<Omega_h::Write<signed_char>,_4>::Few
              ((Few<Omega_h::Write<signed_char>,_4> *)
               &f.parents.codes.write_.shared_alloc_.direct_ptr,
               (Few<Omega_h::Write<signed_char>,_4> *)local_f8);
    pRVar3 = prods2new_ents->array_ + parents.codes.write_.shared_alloc_.direct_ptr._4_4_;
    if (((ulong)(pRVar3->write_).shared_alloc_.alloc & 1) == 0) {
      local_10 = ((pRVar3->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_10 = (ulong)(pRVar3->write_).shared_alloc_.alloc >> 3;
    }
    parallel_for<Omega_h::amr::transfer_inherit<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,std::__cxx11::string_const&)::_lambda(int)_1_&>
              ((LO)(local_10 >> 2),(type *)local_298);
    name_00 = new_data.array_[3].shared_alloc_.direct_ptr;
    IVar2 = local_fc;
    Write<signed_char>::Write
              (&local_2b8,
               (Write<signed_char> *)
               (local_f8 + (long)parents.codes.write_.shared_alloc_.direct_ptr._4_4_ * 0x10));
    Read<signed_char>::Read(&local_2a8,&local_2b8);
    Omega_h::Mesh::add_tag<signed_char>
              (new_mesh,parents.codes.write_.shared_alloc_.direct_ptr._4_4_,(string *)name_00,IVar2,
               &local_2a8,true);
    Read<signed_char>::~Read(&local_2a8);
    Write<signed_char>::~Write(&local_2b8);
    transfer_inherit<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,Omega_h::Few<Omega_h::Read<int>,4>,std::__cxx11::string_const&)
    ::{lambda(int)#1}::~basic_string((_lambda_int__1_ *)local_298);
    Parents::~Parents((Parents *)&f.new_data.array_[3].shared_alloc_.direct_ptr);
    parents.codes.write_.shared_alloc_.direct_ptr._4_4_ =
         parents.codes.write_.shared_alloc_.direct_ptr._4_4_ + 1;
  }
  Few<Omega_h::Write<signed_char>,_4>::~Few((Few<Omega_h::Write<signed_char>,_4> *)local_f8);
  return;
}

Assistant:

void transfer_inherit(Mesh* old_mesh, Mesh* new_mesh,
    Few<LOs, 4> const prods2new_ents, Few<LOs, 4> same_ents2old_ents,
    Few<LOs, 4> same_ents2new_ents, std::string const& name) {
  Few<Write<T>, 4> new_data;
  auto ncomps = old_mesh->get_tag<T>(0, name)->ncomps();
  for (Int prod_dim = 0; prod_dim <= old_mesh->dim(); ++prod_dim) {
    new_data[prod_dim] = Write<T>(new_mesh->nents(prod_dim), -1);
    auto old_data = old_mesh->get_array<T>(prod_dim, name);
    auto same_data =
        read(unmap(same_ents2old_ents[prod_dim], old_data, ncomps));
    map_into(
        same_data, same_ents2new_ents[prod_dim], new_data[prod_dim], ncomps);
  }
  for (Int prod_dim = 0; prod_dim <= old_mesh->dim(); ++prod_dim) {
    auto parents = new_mesh->ask_parents(prod_dim);
    auto f = OMEGA_H_LAMBDA(LO prod) {
      auto prod_ent = prods2new_ents[prod_dim][prod];
      auto parent_ent = parents.parent_idx[prod_ent];
      auto code = parents.codes[prod_ent];
      auto parent_dim = code_parent_dim(code);
      new_data[prod_dim][prod_ent] = new_data[parent_dim][parent_ent];
    };
    parallel_for(prods2new_ents[prod_dim].size(), f);
    new_mesh->add_tag(
        prod_dim, name, ncomps, Read<T>(new_data[prod_dim]), true);
  }
}